

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_resampler.cpp
# Opt level: O0

void __thiscall crnlib::threaded_resampler::free_contrib_lists(threaded_resampler *this)

{
  threaded_resampler *this_local;
  
  if (this->m_pX_contribs != (Contrib_List *)0x0) {
    crnlib_free(this->m_pX_contribs->p);
    this->m_pX_contribs->p = (Contrib *)0x0;
    crnlib_free(this->m_pX_contribs);
    this->m_pX_contribs = (Contrib_List *)0x0;
  }
  if (this->m_pY_contribs != (Contrib_List *)0x0) {
    crnlib_free(this->m_pY_contribs->p);
    this->m_pY_contribs->p = (Contrib *)0x0;
    crnlib_free(this->m_pY_contribs);
    this->m_pY_contribs = (Contrib_List *)0x0;
  }
  return;
}

Assistant:

void threaded_resampler::free_contrib_lists() {
  if (m_pX_contribs) {
    crnlib_free(m_pX_contribs->p);
    m_pX_contribs->p = NULL;

    crnlib_free(m_pX_contribs);
    m_pX_contribs = NULL;
  }

  if (m_pY_contribs) {
    crnlib_free(m_pY_contribs->p);
    m_pY_contribs->p = NULL;

    crnlib_free(m_pY_contribs);
    m_pY_contribs = NULL;
  }
}